

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.c
# Opt level: O0

int lws_service_adjust_timeout(lws_context *context,int timeout_ms,int tsi)

{
  int iVar1;
  lws_context_per_thread *plVar2;
  lws_usec_t lVar3;
  lws *wsi;
  lws_dll2 *d;
  lws_usec_t u;
  lws_context_per_thread *pt;
  int tsi_local;
  int timeout_ms_local;
  lws_context *context_local;
  
  if (context == (lws_context *)0x0) {
    context_local._4_4_ = 1;
  }
  else if (((*(ushort *)&context->field_0x7b7 >> 6 & 1) == 0) &&
          (iVar1 = lws_protocol_init(context), iVar1 != 0)) {
    context_local._4_4_ = 1;
  }
  else {
    if ((tsi == 0) && (iVar1 = lws_smd_message_pending(context), iVar1 != 0)) {
      lws_smd_msg_distribute(context);
      iVar1 = lws_smd_message_pending(context);
      if (iVar1 != 0) {
        return 0;
      }
    }
    plVar2 = context->pt + tsi;
    pt._4_4_ = timeout_ms;
    if (plVar2->evlib_pt != (void *)0x0) {
      lVar3 = lws_now_usecs();
      lVar3 = __lws_sul_service_ripe(plVar2->pt_sul_owner,2,lVar3);
      if (SBORROW8(lVar3,(long)timeout_ms * 1000) != lVar3 + (long)timeout_ms * -1000 < 0) {
        pt._4_4_ = (int)(lVar3 / 1000);
      }
    }
    if (((plVar2->context->tls_ops == (lws_tls_ops *)0x0) ||
        (plVar2->context->tls_ops->fake_POLLIN_for_buffered ==
         (_func_int_lws_context_per_thread_ptr *)0x0)) ||
       (iVar1 = (*plVar2->context->tls_ops->fake_POLLIN_for_buffered)(plVar2), iVar1 == 0)) {
      for (wsi = (lws *)(plVar2->dll_buflist_owner).head; wsi != (lws *)0x0;
          wsi = (lws *)(wsi->a).vhost) {
        if ((*(char *)&(wsi->same_vh_protocol).prev == '\0') &&
           (((ulong)(wsi->sul_connect_timeout).list.owner & 0xffff00000000) != 0x11000000000)) {
          return 0;
        }
      }
      context_local._4_4_ = pt._4_4_;
    }
    else {
      context_local._4_4_ = 0;
    }
  }
  return context_local._4_4_;
}

Assistant:

int
lws_service_adjust_timeout(struct lws_context *context, int timeout_ms, int tsi)
{
	struct lws_context_per_thread *pt;

	if (!context)
		return 1;

        if (!context->protocol_init_done)
                if (lws_protocol_init(context))
                        return 1;

#if defined(LWS_WITH_SYS_SMD)
	if (!tsi && lws_smd_message_pending(context)) {
		lws_smd_msg_distribute(context);
		if (lws_smd_message_pending(context))
			return 0;
	}
#endif

	pt = &context->pt[tsi];

	if (pt->evlib_pt) {
		lws_usec_t u;

		lws_pt_lock(pt, __func__); /* -------------- pt { */

		u = __lws_sul_service_ripe(pt->pt_sul_owner,
				      LWS_COUNT_PT_SUL_OWNERS, lws_now_usecs());
		if (u < (lws_usec_t)timeout_ms * (lws_usec_t)1000)
			timeout_ms = (int)(u / 1000);

		lws_pt_unlock(pt);
	}

	/*
	 * Figure out if we really want to wait in poll()... we only need to
	 * wait if really nothing already to do and we have to wait for
	 * something from network
	 */
#if defined(LWS_ROLE_WS) && !defined(LWS_WITHOUT_EXTENSIONS)
	/* 1) if we know we are draining rx ext, do not wait in poll */
	if (pt->ws.rx_draining_ext_list)
		return 0;
#endif

#if defined(LWS_WITH_TLS)
	/* 2) if we know we have non-network pending data,
	 *    do not wait in poll */

	if (pt->context->tls_ops &&
	    pt->context->tls_ops->fake_POLLIN_for_buffered &&
	    pt->context->tls_ops->fake_POLLIN_for_buffered(pt))
			return 0;
#endif

	/*
	 * 4) If there is any wsi with rxflow buffered and in a state to process
	 *    it, we should not wait in poll
	 */

	lws_start_foreach_dll(struct lws_dll2 *, d, pt->dll_buflist_owner.head) {
		struct lws *wsi = lws_container_of(d, struct lws, dll_buflist);

		if (!lws_is_flowcontrolled(wsi) &&
		     lwsi_state(wsi) != LRS_DEFERRING_ACTION)
			return 0;

	/*
	 * 5) If any guys with http compression to spill, we shouldn't wait in
	 *    poll but hurry along and service them
	 */

	} lws_end_foreach_dll(d);

	return timeout_ms;
}